

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
KTXHeader::ToStringArray_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,KTXHeader *this)

{
  bool bVar1;
  pointer ppVar2;
  __cxx11 local_308 [32];
  __cxx11 local_2e8 [32];
  __cxx11 local_2c8 [32];
  __cxx11 local_2a8 [32];
  __cxx11 local_288 [32];
  __cxx11 local_268 [32];
  __cxx11 local_248 [32];
  __cxx11 local_228 [32];
  __cxx11 local_208 [32];
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  byte local_1d9;
  __cxx11 local_1d8 [32];
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [39];
  allocator local_189;
  string local_188 [8];
  string gl_type_string;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  byte local_159;
  __cxx11 local_158 [32];
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [8];
  string gl_base_internal_format_string;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  byte local_101;
  __cxx11 local_100 [32];
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [8];
  string gl_internal_format_string;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  byte local_a9;
  __cxx11 local_a8 [32];
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [55];
  allocator local_49;
  string local_48 [8];
  string gl_format_string;
  Impl *impl;
  KTXHeader *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"0 (compressed format)",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if ((this->impl_).gl_format != 0) {
    local_a9 = 0;
    local_88._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)KTXInfo::gl_enum_names_abi_cxx11_,&(this->impl_).gl_format);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_88);
    bVar1 = std::operator==(&ppVar2->second,"");
    if (bVar1) {
      std::__cxx11::to_string(local_a8,(this->impl_).gl_format);
      local_a9 = 1;
      std::operator+(local_80,(char *)local_a8);
    }
    else {
      local_b8._M_node =
           (_Base_ptr)
           std::
           multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)KTXInfo::gl_enum_names_abi_cxx11_,&(this->impl_).gl_format);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_b8);
      std::__cxx11::string::string((string *)local_80,(string *)&ppVar2->second);
    }
    std::__cxx11::string::operator=(local_48,(string *)local_80);
    std::__cxx11::string::~string((string *)local_80);
    if ((local_a9 & 1) != 0) {
      std::__cxx11::string::~string((string *)local_a8);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_48);
  local_101 = 0;
  local_e0._M_node =
       (_Base_ptr)
       std::
       multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)KTXInfo::gl_enum_names_abi_cxx11_,&(this->impl_).gl_internal_format);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_e0);
  bVar1 = std::operator==(&ppVar2->second,"");
  if (bVar1) {
    std::__cxx11::to_string(local_100,(this->impl_).gl_internal_format);
    local_101 = 1;
    std::operator+(local_d8,(char *)local_100);
  }
  else {
    local_110._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)KTXInfo::gl_enum_names_abi_cxx11_,&(this->impl_).gl_internal_format);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_110);
    std::__cxx11::string::string((string *)local_d8,(string *)&ppVar2->second);
  }
  if ((local_101 & 1) != 0) {
    std::__cxx11::string::~string((string *)local_100);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,local_d8);
  local_159 = 0;
  local_138._M_node =
       (_Base_ptr)
       std::
       multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)KTXInfo::gl_enum_names_abi_cxx11_,&(this->impl_).gl_base_internal_format);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_138);
  bVar1 = std::operator==(&ppVar2->second,"");
  if (bVar1) {
    std::__cxx11::to_string(local_158,(this->impl_).gl_base_internal_format);
    local_159 = 1;
    std::operator+(local_130,(char *)local_158);
  }
  else {
    local_168._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)KTXInfo::gl_enum_names_abi_cxx11_,&(this->impl_).gl_base_internal_format);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_168);
    std::__cxx11::string::string((string *)local_130,(string *)&ppVar2->second);
  }
  if ((local_159 & 1) != 0) {
    std::__cxx11::string::~string((string *)local_158);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"0 (compressed format)",&local_189);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  if ((this->impl_).gl_type != 0) {
    local_1d9 = 0;
    local_1b8._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)KTXInfo::gl_enum_names_abi_cxx11_,&(this->impl_).gl_type);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_1b8);
    bVar1 = std::operator==(&ppVar2->second,"");
    if (bVar1) {
      std::__cxx11::to_string(local_1d8,(this->impl_).gl_type);
      local_1d9 = 1;
      std::operator+(local_1b0,(char *)local_1d8);
    }
    else {
      local_1e8._M_node =
           (_Base_ptr)
           std::
           multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)KTXInfo::gl_enum_names_abi_cxx11_,&(this->impl_).gl_type);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_1e8);
      std::__cxx11::string::string((string *)local_1b0,(string *)&ppVar2->second);
    }
    std::__cxx11::string::operator=(local_188,(string *)local_1b0);
    std::__cxx11::string::~string((string *)local_1b0);
    if ((local_1d9 & 1) != 0) {
      std::__cxx11::string::~string((string *)local_1d8);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_188);
  std::__cxx11::to_string(local_208,(this->impl_).gl_type_size);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_208);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::to_string(local_228,(this->impl_).pixel_width);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_228);
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::to_string(local_248,(this->impl_).pixel_height);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_248);
  std::__cxx11::string::~string((string *)local_248);
  std::__cxx11::to_string(local_268,(this->impl_).pixel_depth);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_268);
  std::__cxx11::string::~string((string *)local_268);
  std::__cxx11::to_string(local_288,(this->impl_).number_of_array_elements);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_288);
  std::__cxx11::string::~string((string *)local_288);
  std::__cxx11::to_string(local_2a8,(this->impl_).number_of_faces);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_2a8);
  std::__cxx11::string::~string((string *)local_2a8);
  std::__cxx11::to_string(local_2c8,(this->impl_).number_of_mipmap_levels);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_2c8);
  std::__cxx11::string::~string((string *)local_2c8);
  std::__cxx11::to_string(local_2e8,(this->impl_).bytes_of_key_value_data);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_2e8);
  std::__cxx11::string::~string((string *)local_2e8);
  std::__cxx11::to_string(local_308,(this->impl_).endianness);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_308);
  std::__cxx11::string::~string((string *)local_308);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> ToStringArray() {
    std::vector<std::string> output;
    const auto& impl(this->impl_);
    std::string gl_format_string("0 (compressed format)");
    if(impl.gl_format != 0) gl_format_string = ENUM_STRING_LOOKUP(KTXInfo::gl_enum_names,impl.gl_format);
    output.push_back(gl_format_string);
    std::string gl_internal_format_string(ENUM_STRING_LOOKUP(KTXInfo::gl_enum_names,impl.gl_internal_format));
    output.push_back(gl_internal_format_string);
    std::string gl_base_internal_format_string(ENUM_STRING_LOOKUP(KTXInfo::gl_enum_names,impl.gl_base_internal_format));
    output.push_back(gl_base_internal_format_string);
    std::string gl_type_string("0 (compressed format)");
    if(impl.gl_type != 0) gl_type_string = ENUM_STRING_LOOKUP(KTXInfo::gl_enum_names,impl.gl_type);
    output.push_back(gl_type_string);
    output.push_back(std::to_string(impl.gl_type_size));
    output.push_back(std::to_string(impl.pixel_width));
    output.push_back(std::to_string(impl.pixel_height));
    output.push_back(std::to_string(impl.pixel_depth));
    output.push_back(std::to_string(impl.number_of_array_elements));
    output.push_back(std::to_string(impl.number_of_faces));
    output.push_back(std::to_string(impl.number_of_mipmap_levels));
    output.push_back(std::to_string(impl.bytes_of_key_value_data));
    output.push_back(std::to_string(impl.endianness));
    return output;
  }